

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrSenseDataProviderTypeBD value)

{
  bool bVar1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f0;
  allocator local_1d1;
  string local_1d0 [8];
  string error_str_3;
  allocator local_1a9;
  string local_1a8 [8];
  string vuid_3;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_188;
  allocator local_169;
  string local_168 [8];
  string error_str_2;
  allocator local_141;
  string local_140 [8];
  string vuid_2;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_120;
  allocator local_101;
  string local_100 [8];
  string error_str_1;
  allocator local_d9;
  string local_d8 [8];
  string vuid_1;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_b8;
  allocator local_99;
  string local_98 [8];
  string error_str;
  allocator local_61;
  string local_60 [8];
  string vuid;
  XrSenseDataProviderTypeBD value_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *item_name_local;
  string *validation_name_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_sensing"), !bVar1))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"VUID-",&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::operator+=(local_60,(string *)validation_name);
    std::__cxx11::string::operator+=(local_60,"-");
    std::__cxx11::string::operator+=(local_60,(string *)item_name);
    std::__cxx11::string::operator+=(local_60,"-parameter");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"XrSenseDataProviderTypeBD requires extension ",&local_99)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::operator+=
              (local_98," \"XR_BD_spatial_sensing\" to be enabled, but it is not enabled");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_b8,objects_info);
    CoreValidLogMessage(instance_info,(string *)local_60,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                        command_name,&local_b8,(string *)local_98);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_b8);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
    return false;
  }
  if (value == XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_anchor"), !bVar1)
       ) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"VUID-",&local_d9);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      std::__cxx11::string::operator+=(local_d8,(string *)validation_name);
      std::__cxx11::string::operator+=(local_d8,"-");
      std::__cxx11::string::operator+=(local_d8,(string *)item_name);
      std::__cxx11::string::operator+=(local_d8,"-parameter");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD\"",
                 &local_101);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::__cxx11::string::operator+=(local_100," being used, which requires extension ");
      std::__cxx11::string::operator+=
                (local_100," \"XR_BD_spatial_anchor\" to be enabled, but it is not enabled");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_120,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_120,(string *)local_100);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_d8);
      return false;
    }
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_scene"), !bVar1))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"VUID-",&local_141);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::__cxx11::string::operator+=(local_140,(string *)validation_name);
      std::__cxx11::string::operator+=(local_140,"-");
      std::__cxx11::string::operator+=(local_140,(string *)item_name);
      std::__cxx11::string::operator+=(local_140,"-parameter");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_168,
                 "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD\"",
                 &local_169);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::__cxx11::string::operator+=(local_168," being used, which requires extension ");
      std::__cxx11::string::operator+=
                (local_168," \"XR_BD_spatial_scene\" to be enabled, but it is not enabled");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_188,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_140,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_188,(string *)local_168);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_188);
      std::__cxx11::string::~string(local_168);
      std::__cxx11::string::~string(local_140);
      return false;
    }
    instance_info_local._7_1_ = true;
  }
  else if (value == XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD) {
    if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
       (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_BD_spatial_mesh"), !bVar1))
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,"VUID-",&local_1a9);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      std::__cxx11::string::operator+=(local_1a8,(string *)validation_name);
      std::__cxx11::string::operator+=(local_1a8,"-");
      std::__cxx11::string::operator+=(local_1a8,(string *)item_name);
      std::__cxx11::string::operator+=(local_1a8,"-parameter");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d0,"XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD\""
                 ,&local_1d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      std::__cxx11::string::operator+=(local_1d0," being used, which requires extension ");
      std::__cxx11::string::operator+=
                (local_1d0," \"XR_BD_spatial_mesh\" to be enabled, but it is not enabled");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f0,objects_info);
      CoreValidLogMessage(instance_info,(string *)local_1a8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_1f0,(string *)local_1d0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_1f0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1a8);
      return false;
    }
    instance_info_local._7_1_ = true;
  }
  else {
    instance_info_local._7_1_ = false;
  }
  return instance_info_local._7_1_;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrSenseDataProviderTypeBD value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_BD_spatial_sensing, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_sensing")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrSenseDataProviderTypeBD requires extension ";
        error_str += " \"XR_BD_spatial_sensing\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD requires extension XR_BD_spatial_anchor, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_anchor")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_ANCHOR_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_anchor\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD requires extension XR_BD_spatial_scene, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_scene")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_SCENE_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_scene\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD:
            // Enum value XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD requires extension XR_BD_spatial_mesh, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_spatial_mesh")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSenseDataProviderTypeBD value \"XR_SENSE_DATA_PROVIDER_TYPE_MESH_BD\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_BD_spatial_mesh\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}